

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

bool IsLegalOpcodeForPathDepBrFold(Instr *instr)

{
  OpCode OVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  bool bVar3;
  
  bVar2 = IR::Instr::IsRealInstr(instr);
  bVar3 = true;
  if (bVar2) {
    OVar1 = instr->m_opcode;
    if ((((OVar1 != Ld_A) && (OVar1 != LdFld)) && (OVar1 != Ld_I4)) &&
       ((OVar1 != ByteCodeUses && (OVar1 != InlineeEnd)))) {
      sourceContextId = Func::GetSourceContextId(instr->m_func);
      functionId = Func::GetLocalFunctionId(instr->m_func);
      bVar2 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01453738,PathDepBranchFoldingPhase,sourceContextId,
                         functionId);
      if ((bVar2) && (DAT_0145948a == '\x01')) {
        bVar3 = false;
        Output::Print(L"Skipping PathDependentBranchFolding due to: ");
        IR::Instr::Dump(instr);
      }
      else {
        bVar3 = false;
      }
    }
  }
  return bVar3;
}

Assistant:

static bool IsLegalOpcodeForPathDepBrFold(IR::Instr *instr)
{
    if (!instr->IsRealInstr())
    {
        return true;
    }
    switch (instr->m_opcode)
    {
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:
    case Js::OpCode::LdFld:
    case Js::OpCode::ByteCodeUses:
    case Js::OpCode::InlineeEnd:
        return true;
    }
#if DBG
    if (PHASE_TRACE(Js::PathDepBranchFoldingPhase, instr->m_func) && Js::Configuration::Global.flags.Verbose)
    {
        Output::Print(_u("Skipping PathDependentBranchFolding due to: "));
        instr->Dump();
    }
#endif
    return false;
}